

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

bool __thiscall
slang::IntervalMap<int,_int,_0U>::iterator::erase
          (iterator *this,allocator_type *alloc,bool shouldRecomputeBounds)

{
  uint32_t uVar1;
  IntervalMap<int,_int,_0U> *pIVar2;
  pointer pEVar3;
  size_type sVar4;
  FreeNode *pFVar5;
  uint32_t uVar6;
  uintptr_t intWord;
  ulong uVar7;
  uint uVar8;
  
  pIVar2 = (this->super_const_iterator).map;
  pEVar3 = (this->super_const_iterator).path.path.
           super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  sVar4 = (this->super_const_iterator).path.path.
          super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len;
  uVar8 = pEVar3[sVar4 - 1].offset;
  uVar6 = pIVar2->height;
  if (uVar6 == 0) {
    uVar6 = pIVar2->rootSize;
    if (uVar6 != uVar8 + 1) {
      do {
        uVar7 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        *(undefined8 *)((long)&pIVar2->field_0 + uVar7 * 8) =
             *(undefined8 *)((long)&pIVar2->field_0 + (ulong)uVar8 * 8);
        *(undefined4 *)((long)&pIVar2->field_0 + uVar7 * 4 + 0x80) =
             *(undefined4 *)((long)&pIVar2->field_0 + (ulong)uVar8 * 4 + 0x80);
      } while (uVar6 - 1 != uVar8);
    }
    uVar6 = pIVar2->rootSize - 1;
    pIVar2->rootSize = uVar6;
    ((this->super_const_iterator).path.path.
     super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_)->size = uVar6;
  }
  else {
    pFVar5 = (FreeNode *)pEVar3[sVar4 - 1].node;
    uVar1 = pEVar3[sVar4 - 1].size;
    if (uVar1 == 1) {
      pFVar5->next = alloc->freeList;
      alloc->freeList = pFVar5;
      eraseNode(this,uVar6,alloc);
      return true;
    }
    if (uVar1 != uVar8 + 1) {
      do {
        uVar7 = (ulong)uVar8;
        uVar8 = uVar8 + 1;
        pFVar5[uVar7].next = pFVar5[uVar8].next;
        *(undefined4 *)((long)&pFVar5[0x10].next + uVar7 * 4) =
             *(undefined4 *)((long)&pFVar5[0x10].next + (ulong)uVar8 * 4);
      } while (uVar1 - 1 != uVar8);
    }
    uVar8 = pIVar2->height;
    pEVar3 = (this->super_const_iterator).path.path.
             super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
    uVar6 = pEVar3[(this->super_const_iterator).path.path.
                   super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len - 1].size;
    pEVar3[uVar8].size = uVar6 - 1;
    if ((ulong)uVar8 != 0) {
      *(ulong *)((long)pEVar3[uVar8 - 1].node + (ulong)pEVar3[uVar8 - 1].offset * 8) =
           *(ulong *)((long)pEVar3[uVar8 - 1].node + (ulong)pEVar3[uVar8 - 1].offset * 8) &
           0xffffffffffffffc0 | (ulong)(uVar6 - 2);
    }
    if (shouldRecomputeBounds) {
      recomputeBounds(this,uVar8);
    }
  }
  return false;
}

Assistant:

bool IntervalMap<TKey, TValue, N>::iterator::erase(allocator_type& alloc,
                                                   bool shouldRecomputeBounds) {
    auto& map = *this->map;
    auto& path = this->path;
    SLANG_ASSERT(this->valid());

    uint32_t offset = path.leafOffset();
    if (this->isFlat()) {
        map.rootLeaf.erase(offset, offset + 1, map.rootSize);
        path.setSize(0, --map.rootSize);
        return false;
    }

    // Nodes are not allowed to become empty, so erase the node itself
    // if that were to be the case.
    auto& node = path.template leaf<Leaf>();
    if (path.leafSize() == 1) {
        alloc.destroy(&node);
        eraseNode(map.height, alloc);
        return true;
    }

    // Otherwise just erase the current entry.
    node.erase(offset, offset + 1, path.leafSize());
    path.setSize(map.height, path.leafSize() - 1);

    if (shouldRecomputeBounds)
        recomputeBounds(map.height);

    return false;
}